

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall DPSprite::Tick(DPSprite *this)

{
  FState *newstate;
  DPSprite *this_local;
  
  if (((this->processPending & 1U) != 0) && (this->Tics != -1)) {
    this->Tics = this->Tics + -1;
    if (((this->Flags & 4U) != 0) && ((this->Tics != 0 && ((this->Owner->cheats & 0x200000U) != 0)))
       ) {
      this->Tics = this->Tics + -1;
    }
    if (this->Tics == 0) {
      newstate = FState::GetNextState(this->State);
      SetState(this,newstate,false);
    }
  }
  return;
}

Assistant:

void DPSprite::Tick()
{
	if (processPending)
	{
		// drop tic count and possibly change state
		if (Tics != -1)	// a -1 tic count never changes
		{
			Tics--;

			// [BC] Apply double firing speed.
			if ((Flags & PSPF_POWDOUBLE) && Tics && (Owner->cheats & CF_DOUBLEFIRINGSPEED))
				Tics--;

			if (!Tics)
				SetState(State->GetNextState());
		}
	}
}